

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instantiation.cpp
# Opt level: O0

void __thiscall Inferences::Instantiation::registerClause(Instantiation *this,Clause *cl)

{
  TermList key;
  TermList key_00;
  bool bVar1;
  Elem ppLVar2;
  long in_RDI;
  Stack<Kernel::Term_*> *cans;
  Set<Kernel::Term_*,_Lib::DefaultHash> *cans_check;
  TermList sort;
  TermList t;
  SubtermIterator it;
  Literal *lit;
  StlIter __end1;
  StlIter __begin1;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
  *__range1;
  TermList in_stack_fffffffffffffe98;
  SubtermIterator *in_stack_fffffffffffffea0;
  Term *in_stack_fffffffffffffea8;
  Clause *in_stack_fffffffffffffeb0;
  Term *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  SubtermIterator *local_c0;
  Clause *local_b8;
  TermList local_b0;
  uint64_t local_a8;
  TermList local_a0;
  uint64_t local_98;
  Literal *local_58;
  undefined1 local_30 [24];
  undefined1 *local_18;
  
  Kernel::Clause::iterLits(in_stack_fffffffffffffeb0);
  local_18 = local_30;
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::begin((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
           *)in_stack_fffffffffffffe98._content);
  Lib::
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
  ::end((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>
         *)in_stack_fffffffffffffe98._content);
  while (bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffffea0,
                                 (StlIter *)in_stack_fffffffffffffe98._content), bVar1) {
    ppLVar2 = Lib::
              IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
              ::StlIter::operator*((StlIter *)0x7fa5b1);
    local_58 = *ppLVar2;
    Kernel::SubtermIterator::SubtermIterator
              ((SubtermIterator *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    while (bVar1 = Kernel::SubtermIterator::hasNext((SubtermIterator *)in_stack_fffffffffffffea8),
          bVar1) {
      local_98 = (uint64_t)Kernel::SubtermIterator::next(in_stack_fffffffffffffe98._content);
      bVar1 = Kernel::TermList::isTerm((TermList *)0x7fa62b);
      if (bVar1) {
        Kernel::TermList::term((TermList *)0x7fa64b);
        bVar1 = Kernel::Term::ground((Term *)0x7fa65c);
        if (bVar1) {
          Kernel::TermList::TermList(&local_a0);
          local_a8 = local_98;
          bVar1 = Kernel::SortHelper::tryGetResultSort
                            (in_stack_fffffffffffffe98,(TermList *)0x7fa6a3);
          if (bVar1) {
            local_b0 = Kernel::AtomicSort::defaultSort();
            bVar1 = Kernel::TermList::operator==(&local_a0,&local_b0);
            if (!bVar1) {
              local_b8 = (Clause *)0x0;
              local_c0 = (SubtermIterator *)0x0;
              bVar1 = Lib::
                      DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                      ::isEmpty((DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                                 *)(in_RDI + 0x38));
              if ((bVar1) ||
                 (bVar1 = Lib::
                          DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                          ::find((DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                                  *)in_stack_fffffffffffffea8,(TermList *)in_stack_fffffffffffffea0,
                                 (Stack<Kernel::Term_*> **)in_stack_fffffffffffffe98._content),
                 !bVar1)) {
                local_b8 = (Clause *)
                           Lib::Set<Kernel::Term*,Lib::DefaultHash>::operator_new(0x7fa78a);
                Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::Set
                          ((Set<Kernel::Term_*,_Lib::DefaultHash> *)0x7fa79b);
                local_c0 = (SubtermIterator *)Lib::Stack<Kernel::Term*>::operator_new(0x7fa7b4);
                Lib::Stack<Kernel::Term_*>::Stack
                          ((Stack<Kernel::Term_*> *)in_stack_fffffffffffffeb0,
                           (size_t)in_stack_fffffffffffffea8);
                key._content._7_1_ = in_stack_fffffffffffffec7;
                key._content._0_7_ = in_stack_fffffffffffffec0;
                Lib::
                DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert((DHMap<Kernel::TermList,_Lib::Stack<Kernel::Term_*>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)in_stack_fffffffffffffeb8,key,
                         (Stack<Kernel::Term_*> *)in_stack_fffffffffffffeb0);
                key_00._content._7_1_ = in_stack_fffffffffffffec7;
                key_00._content._0_7_ = in_stack_fffffffffffffec0;
                Lib::
                DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert((DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)in_stack_fffffffffffffeb8,key_00,
                         (Set<Kernel::Term_*,_Lib::DefaultHash> *)in_stack_fffffffffffffeb0);
              }
              else {
                Lib::
                DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::find((DHMap<Kernel::TermList,_Lib::Set<Kernel::Term_*,_Lib::DefaultHash>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                        *)in_stack_fffffffffffffea8,(TermList *)in_stack_fffffffffffffea0,
                       (Set<Kernel::Term_*,_Lib::DefaultHash> **)in_stack_fffffffffffffe98._content)
                ;
              }
              Kernel::TermList::term((TermList *)0x7fa8e0);
              in_stack_fffffffffffffec7 =
                   Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::contains
                             ((Set<Kernel::Term_*,_Lib::DefaultHash> *)in_stack_fffffffffffffeb8,
                              (Term *)in_stack_fffffffffffffeb0);
              if (!(bool)in_stack_fffffffffffffec7) {
                in_stack_fffffffffffffeb8 = Kernel::TermList::term((TermList *)0x7fa920);
                Lib::Set<Kernel::Term_*,_Lib::DefaultHash>::insert
                          ((Set<Kernel::Term_*,_Lib::DefaultHash> *)local_b8,
                           in_stack_fffffffffffffea8);
                in_stack_fffffffffffffea8 = Kernel::TermList::term((TermList *)0x7fa952);
                Lib::Stack<Kernel::Term_*>::push
                          ((Stack<Kernel::Term_*> *)local_c0,
                           (Term *)in_stack_fffffffffffffe98._content);
                in_stack_fffffffffffffea0 = local_c0;
                in_stack_fffffffffffffeb0 = local_b8;
              }
            }
          }
        }
      }
    }
    Kernel::SubtermIterator::~SubtermIterator(in_stack_fffffffffffffea0);
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>
    ::StlIter::operator++((StlIter *)in_stack_fffffffffffffea0);
  }
  return;
}

Assistant:

void Instantiation::registerClause(Clause* cl)
{
  ASS(cl);

  //cout << "register " << cl->toString() << endl;

  for (Literal* lit : cl->iterLits()) {
    SubtermIterator it(lit);
    while(it.hasNext()){
      TermList t = it.next();
      if(t.isTerm() && t.term()->ground()){
        TermList sort;
        if(SortHelper::tryGetResultSort(t,sort)){
          if(sort==AtomicSort::defaultSort()) continue;
          Set<Term*>* cans_check=0;
          Stack<Term*>* cans=0;
          if(sorted_candidates.isEmpty() || !sorted_candidates.find(sort,cans)){
            cans_check = new Set<Term*>();
            cans = new Stack<Term*>();
            sorted_candidates.insert(sort,cans);
            sorted_candidates_check.insert(sort,cans_check);
          }
          else{ ALWAYS(sorted_candidates_check.find(sort,cans_check)); }
          ASS(cans_check && cans);
          // cout << "For sort " << sort << " there are " << cans->size() << " cans" <<endl;
          if(!cans_check->contains(t.term())){
            cans_check->insert(t.term());
            cans->push(t.term());
          }
        }
      }
    }
  }

}